

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

bool __thiscall
cplus::utils::Stack<cplus::lang::StringSet::TreeNode_**>::pop
          (Stack<cplus::lang::StringSet::TreeNode_**> *this,TreeNode ***buffer)

{
  TreeNode ***a;
  StackPoint *pSVar1;
  bool bVar2;
  TreeNode ***buffer_local;
  Stack<cplus::lang::StringSet::TreeNode_**> *this_local;
  
  if (this->lastState != (StackPoint *)0x0) {
    if (this->lastState != (StackPoint *)0x0) {
      operator_delete(this->lastState);
    }
    this->lastState = (StackPoint *)0x0;
  }
  bVar2 = this->stackSize != 0;
  if (bVar2) {
    a = StackPoint::get(this->state);
    memory::copy<cplus::lang::StringSet::TreeNode**>(a,buffer);
    this->lastState = this->state;
    pSVar1 = StackPoint::prev(this->state);
    this->state = pSVar1;
    this->stackSize = this->stackSize - 1;
  }
  return bVar2;
}

Assistant:

bool pop(const T &buffer) {
//				std::cout << "Stack: bool pop(const K &buffer)" << std::endl;
				if (lastState != nullptr) {
					delete lastState;
					lastState = nullptr;
				}
				if (stackSize != 0) {
					::cplus::memory::copy(this->state->get(), buffer);
					lastState = this->state;
					this->state = this->state->prev();
					--stackSize;
					return true;
				} else {
					return false;
				}
			}